

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double sech_cdf(double x,double a,double b)

{
  double dVar1;
  
  dVar1 = exp((x - a) / b);
  dVar1 = atan(dVar1);
  return (dVar1 + dVar1) / 3.141592653589793;
}

Assistant:

double sech_cdf ( double x, double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    SECH_CDF evaluates the Hyperbolic Secant CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Input, double A, B, the parameter of the PDF.
//    0.0 < B.
//
//    Output, double SECH_CDF, the value of the CDF.
//
{
  double cdf;
  const double r8_pi = 3.14159265358979323;
  double y;

  y = ( x - a ) / b;

  cdf = 2.0 * atan ( exp ( y ) ) / r8_pi;

  return cdf;
}